

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O3

void __thiscall QTextHtmlParser::applyAttributes(QTextHtmlParser *this,QStringList *attributes)

{
  QTextCharFormat *this_00;
  QTextBlockFormat *this_01;
  QTextHTMLElements QVar1;
  QTextHtmlParserNode *this_02;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  int iVar4;
  QColor *pQVar5;
  QStringView QVar6;
  bool bVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  QArrayData *pQVar10;
  char cVar11;
  byte bVar12;
  ushort uVar13;
  int iVar14;
  uint uVar15;
  iterator iVar16;
  QString *pQVar17;
  long lVar18;
  qsizetype qVar19;
  byte bVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  undefined8 *puVar24;
  QTextFormat *pQVar25;
  ulong uVar26;
  long in_FS_OFFSET;
  qreal qVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  QStringView QVar32;
  QStringView QVar33;
  QStringView QVar34;
  QStringView QVar35;
  QStringView QVar36;
  QStringView QVar37;
  QStringView QVar38;
  QStringView QVar39;
  QLatin1String QVar40;
  QStringView QVar41;
  QStringView QVar42;
  QStringView QVar43;
  QStringView QVar44;
  QStringView QVar45;
  QStringView QVar46;
  QStringView QVar47;
  QStringView QVar48;
  QStringView QVar49;
  QStringView QVar50;
  QStringView QVar51;
  QStringView QVar52;
  QStringView QVar53;
  QStringView QVar54;
  QStringView QVar55;
  QStringView QVar56;
  QStringView QVar57;
  QStringView QVar58;
  QStringView QVar59;
  QStringView QVar60;
  QStringView QVar61;
  QStringView QVar62;
  QStringView QVar63;
  QStringView QVar64;
  QStringView QVar65;
  QStringView QVar66;
  QStringView QVar67;
  QStringView QVar68;
  QStringView QVar69;
  QStringView QVar70;
  QStringView QVar71;
  QStringView QVar72;
  QStringView QVar73;
  QStringView QVar74;
  QStringView QVar75;
  QStringView QVar76;
  QStringView QVar77;
  QStringView QVar78;
  QStringView QVar79;
  QStringView QVar80;
  QStringView QVar81;
  QStringView QVar82;
  QStringView QVar83;
  QStringView QVar84;
  QStringView QVar85;
  QStringView QVar86;
  QStringView QVar87;
  QStringView QVar88;
  QStringView QVar89;
  QStringView QVar90;
  QStringView QVar91;
  QStringView QVar92;
  QColor QVar93;
  undefined1 auVar94 [16];
  QAnyStringView name;
  QAnyStringView name_00;
  QAnyStringView name_01;
  QColor color;
  QLatin1String QVar95;
  QLatin1String QVar96;
  QLatin1String QVar97;
  QLatin1String QVar98;
  QLatin1String QVar99;
  QLatin1String QVar100;
  QLatin1String QVar101;
  QLatin1String QVar102;
  QLatin1String QVar103;
  QLatin1String QVar104;
  QLatin1String QVar105;
  QLatin1String QVar106;
  QLatin1String QVar107;
  QLatin1String QVar108;
  QLatin1String QVar109;
  QLatin1String QVar110;
  QLatin1String QVar111;
  QLatin1String QVar112;
  QLatin1String QVar113;
  QLatin1String QVar114;
  QLatin1String QVar115;
  QLatin1String QVar116;
  QLatin1String QVar117;
  QLatin1String QVar118;
  QLatin1String QVar119;
  QLatin1String QVar120;
  QLatin1String QVar121;
  QLatin1String QVar122;
  QLatin1String QVar123;
  QLatin1String QVar124;
  QLatin1String QVar125;
  QLatin1String QVar126;
  QLatin1String QVar127;
  QLatin1String QVar128;
  QLatin1String QVar129;
  QLatin1String QVar130;
  QLatin1String QVar131;
  QLatin1String QVar132;
  QLatin1String QVar133;
  QLatin1String QVar134;
  QLatin1String QVar135;
  QLatin1String QVar136;
  QLatin1String QVar137;
  QLatin1String QVar138;
  QLatin1String QVar139;
  QLatin1String QVar140;
  QLatin1String QVar141;
  QLatin1String QVar142;
  QLatin1String QVar143;
  QLatin1String QVar144;
  QLatin1String QVar145;
  QLatin1String QVar146;
  QLatin1String QVar147;
  QLatin1String QVar148;
  QLatin1String QVar149;
  QLatin1String QVar150;
  QLatin1String QVar151;
  QLatin1String QVar152;
  QLatin1String QVar153;
  QLatin1String QVar154;
  iterator __begin6;
  QString local_130;
  QString local_118;
  QString local_f8;
  QString local_d8;
  QStringTokenizerBase<QStringView,_QChar> local_b8;
  QArrayDataPointer<QString> local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  char *pcStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8.d.size = 0;
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (char16_t *)0x0;
  local_f8.d.size = 0;
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = (storage_type_conflict *)0x0;
  if (((attributes->d).size & 1) == 0) {
    iVar16 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
    if ((attributes->d).size != 0) {
      this_02 = iVar16.i[-1];
      this_01 = &this_02->blockFormat;
      this_00 = &this_02->charFormat;
      uVar26 = 0;
      bVar20 = 0;
      do {
        pQVar17 = (attributes->d).ptr;
        pQVar2 = &(pQVar17[uVar26].d.d)->super_QArrayData;
        pcVar3 = pQVar17[uVar26].d.ptr;
        lVar18 = pQVar17[uVar26].d.size;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          pQVar17 = (attributes->d).ptr;
        }
        uVar21 = uVar26 | 1;
        local_118.d.d = pQVar17[uVar21].d.d;
        local_118.d.ptr = pQVar17[uVar21].d.ptr;
        local_118.d.size = pQVar17[uVar21].d.size;
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QVar1 = this_02->id;
        pQVar25 = &this_00->super_QTextFormat;
        if (QVar1 < Html_table) {
          switch(QVar1) {
          case Html_font:
            if (lVar18 != 5) {
              if (lVar18 == 4) {
                QVar41.m_data = pcVar3;
                QVar41.m_size = 4;
                QVar107.m_data = "size";
                QVar107.m_size = 4;
                cVar11 = QtPrivate::equalStrings(QVar41,QVar107);
                if ((cVar11 == '\0') || ((undefined8 *)local_118.d.size == (undefined8 *)0x0)) {
                  QVar57.m_data = pcVar3;
                  QVar57.m_size = 4;
                  QVar120.m_data = "face";
                  QVar120.m_size = 4;
                  cVar11 = QtPrivate::equalStrings(QVar57,QVar120);
                  if (cVar11 != '\0') {
                    local_78._0_4_ = (undefined4)local_118.d.size;
                    local_78._4_4_ = (undefined4)((ulong)local_118.d.size >> 0x20);
                    local_78._8_4_ = SUB84(local_118.d.ptr,0);
                    local_78._12_4_ = (undefined4)((ulong)local_118.d.ptr >> 0x20);
                    qVar19 = QStringView::indexOf
                                       ((QStringView *)&local_78,(QChar)0x2c,0,CaseSensitive);
                    if (qVar19 != -1) {
                      local_98.d = (Data *)0x0;
                      local_98.ptr = (QString *)0x0;
                      local_98.size = 0;
                      local_b8.super_QStringTokenizerBaseBase.m_sb.
                      super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                           (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
                      local_b8.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
                      local_b8.m_haystack.m_size = local_118.d.size;
                      local_b8.m_haystack.m_data = local_118.d.ptr;
                      local_b8.m_needle.ucs = L',';
                      local_48 = &DAT_aaaaaaaaaaaaaaaa;
                      local_58 = &DAT_aaaaaaaaaaaaaaaa;
                      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
                      local_78._16_4_ = 0xaaaaaaaa;
                      local_78._20_4_ = 0xaaaaaaaa;
                      pcStack_60 = &DAT_aaaaaaaaaaaaaaaa;
                      local_78._0_4_ = 0xaaaaaaaa;
                      local_78._4_4_ = 0xaaaaaaaa;
                      local_78._8_4_ = 0xaaaaaaaa;
                      local_78._12_4_ = 0xaaaaaaaa;
                      QStringTokenizerBase<QStringView,_QChar>::iterator::iterator
                                ((iterator *)&local_78,&local_b8);
                      if ((char)pcStack_60 == '\x01') {
                        do {
                          QVar6.m_size._4_4_ = local_78._12_4_;
                          QVar6.m_size._0_4_ = local_78._8_4_;
                          QVar6.m_data._0_4_ = local_78._16_4_;
                          QVar6.m_data._4_4_ = local_78._20_4_;
                          auVar94 = QtPrivate::trimmed(QVar6);
                          QString::QString(&local_130,auVar94._8_8_,auVar94._0_8_);
                          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                                    ((QMovableArrayOps<QString> *)&local_98,local_98.size,&local_130
                                    );
                          QList<QString>::end((QList<QString> *)&local_98);
                          if (&(local_130.d.d)->super_QArrayData != (QArrayData *)0x0) {
                            LOCK();
                            ((local_130.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i =
                                 ((local_130.d.d)->super_QArrayData).ref_._q_value.
                                 super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if (((local_130.d.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate(&(local_130.d.d)->super_QArrayData,2,0x10);
                            }
                          }
                          QStringTokenizerBase<QStringView,_QChar>::iterator::advance
                                    ((iterator *)&local_78);
                        } while ((char)pcStack_60 != '\0');
                      }
                      ::QVariant::QVariant((QVariant *)&local_78,(QList_conflict *)&local_98);
                      QTextFormat::setProperty
                                (&this_00->super_QTextFormat,0x1fe7,(QVariant *)&local_78);
                      ::QVariant::~QVariant((QVariant *)&local_78);
                      QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
                      break;
                    }
                    local_b8.super_QStringTokenizerBaseBase.m_sb.
                    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                    super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                         (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
                    local_b8.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
                    local_b8.m_haystack.m_size = 0;
                    local_b8.m_haystack.m_data = (storage_type_conflict *)0x0;
                    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                              ((QMovableArrayOps<QString> *)&local_b8,0,&local_118);
                    QList<QString>::end((QList<QString> *)&local_b8);
                    ::QVariant::QVariant((QVariant *)&local_78,(QList_conflict *)&local_b8);
                    QTextFormat::setProperty
                              (&this_00->super_QTextFormat,0x1fe7,(QVariant *)&local_78);
                    ::QVariant::~QVariant((QVariant *)&local_78);
                    QArrayDataPointer<QString>::~QArrayDataPointer
                              ((QArrayDataPointer<QString> *)&local_b8);
                  }
                }
                else {
                  QVar42.m_data = local_118.d.ptr;
                  QVar42.m_size = local_118.d.size;
                  lVar18 = QString::toIntegral_helper(QVar42,(bool *)0x0,10);
                  iVar14 = (int)lVar18;
                  if (iVar14 != lVar18) {
                    iVar14 = 0;
                  }
                  iVar4 = iVar14 + -3;
                  if (((char16_t)*(Spec *)local_118.d.ptr + L'ￕ' & 0xfffdU) == 0) {
                    iVar4 = iVar14;
                  }
                  ::QVariant::QVariant((QVariant *)&local_78,iVar4);
                  iVar14 = 0x2002;
LAB_00512f4a:
                  QTextFormat::setProperty(&this_00->super_QTextFormat,iVar14,(QVariant *)&local_78)
                  ;
                  ::QVariant::~QVariant((QVariant *)&local_78);
                }
                goto switchD_00513631_caseD_4;
              }
              break;
            }
            QVar51.m_data = pcVar3;
            QVar51.m_size = 5;
            QVar115.m_data = "color";
            QVar115.m_size = 5;
            cVar11 = QtPrivate::equalStrings(QVar51,QVar115);
            if (cVar11 != '\0') {
              local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
              name_00.field_0.m_data = (void *)(local_118.d.size | 0x8000000000000000);
              name_00.m_size = extraout_RDX_01;
              QVar93 = QColor::fromString((QColor *)local_118.d.ptr,name_00);
              local_98.d = QVar93._0_8_;
              local_98.ptr._0_6_ = QVar93.ct._4_6_;
              if (QVar93.cspec == Invalid) {
                local_78._0_4_ = 2;
                local_78._4_4_ = 0;
                local_78._8_4_ = 0;
                local_78._12_4_ = 0;
                local_78._16_4_ = 0;
                local_78._20_4_ = 0;
                pcStack_60 = "default";
                QString::toLatin1_helper((QString *)&local_b8);
                puVar24 = (undefined8 *)local_b8.m_haystack.m_size;
                if ((undefined8 *)local_b8.m_haystack.m_size == (undefined8 *)0x0) {
                  puVar24 = &QByteArray::_empty;
                }
                QMessageLogger::warning
                          ((char *)local_78.data,
                           "QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",puVar24);
                if (local_b8.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
                  LOCK();
                  *(int *)local_b8.super_QStringTokenizerBaseBase =
                       *(int *)local_b8.super_QStringTokenizerBaseBase + -1;
                  UNLOCK();
                  if (*(int *)local_b8.super_QStringTokenizerBaseBase == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)local_b8.super_QStringTokenizerBaseBase,1,0x10);
                  }
                }
              }
              QBrush::QBrush((QBrush *)&local_b8,(QColor *)&local_98,SolidPattern);
              QBrush::operator_cast_to_QVariant((QVariant *)&local_78,(QBrush *)&local_b8);
              QTextFormat::setProperty(&this_00->super_QTextFormat,0x821,(QVariant *)&local_78);
              ::QVariant::~QVariant((QVariant *)&local_78);
              QBrush::~QBrush((QBrush *)&local_b8);
            }
            goto switchD_00513631_caseD_5;
          case Html_ul:
          case Html_ol:
            if (lVar18 == 5) {
              QVar46.m_data = pcVar3;
              QVar46.m_size = 5;
              QVar111.m_data = "start";
              QVar111.m_size = 5;
              cVar11 = QtPrivate::equalStrings(QVar46,QVar111);
              if (cVar11 != '\0') {
                local_78._0_4_ = local_78._0_4_ & 0xffffff00;
                QVar47.m_data = local_118.d.ptr;
                QVar47.m_size = local_118.d.size;
                lVar18 = QString::toIntegral_helper(QVar47,(bool *)local_78.data,10);
                if (((int)lVar18 == lVar18) && ((local_78._0_4_ & 1) != 0)) {
                  this_02->listStart = (int)lVar18;
                }
              }
              goto switchD_00513631_caseD_5;
            }
            if (lVar18 == 4) {
              QVar28.m_data = pcVar3;
              QVar28.m_size = 4;
              QVar95.m_data = "type";
              QVar95.m_size = 4;
              cVar11 = QtPrivate::equalStrings(QVar28,QVar95);
              pcVar3 = local_118.d.ptr;
              if (cVar11 != '\0') {
                this_02->field_0x90 = this_02->field_0x90 | 4;
                if ((undefined8 *)local_118.d.size == (undefined8 *)0x1) {
                  QVar29.m_data = local_118.d.ptr;
                  QVar29.m_size = 1;
                  QVar96.m_data = "1";
                  QVar96.m_size = 1;
                  cVar11 = QtPrivate::equalStrings(QVar29,QVar96);
                  if (cVar11 == '\0') {
                    QVar67.m_data = pcVar3;
                    QVar67.m_size = 1;
                    QVar129.m_data = "a";
                    QVar129.m_size = 1;
                    cVar11 = QtPrivate::equalStrings(QVar67,QVar129);
                    if (cVar11 == '\0') {
                      QVar78.m_data = pcVar3;
                      QVar78.m_size = 1;
                      QVar140.m_data = "A";
                      QVar140.m_size = 1;
                      cVar11 = QtPrivate::equalStrings(QVar78,QVar140);
                      if (cVar11 == '\0') {
                        QVar86.m_data = pcVar3;
                        QVar86.m_size = 1;
                        QVar148.m_data = "i";
                        QVar148.m_size = 1;
                        cVar11 = QtPrivate::equalStrings(QVar86,QVar148);
                        if (cVar11 == '\0') {
                          QVar87.m_data = pcVar3;
                          QVar87.m_size = 1;
                          QVar149.m_data = "I";
                          QVar149.m_size = 1;
                          cVar11 = QtPrivate::equalStrings(QVar87,QVar149);
                          if (cVar11 == '\0') goto LAB_00514455;
                          this_02->listStyle = ListUpperRoman;
                        }
                        else {
                          this_02->listStyle = ListLowerRoman;
                        }
                      }
                      else {
                        this_02->listStyle = ListUpperAlpha;
                      }
                    }
                    else {
                      this_02->listStyle = ListLowerAlpha;
                    }
                  }
                  else {
                    this_02->listStyle = ListDecimal;
                  }
                }
                else {
LAB_00514455:
                  QString::toLower_helper((QString *)local_78.data);
                  pDVar8 = local_118.d.d;
                  pQVar10 = (QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_);
                  pQVar5 = (QColor *)CONCAT44(local_78._12_4_,local_78._8_4_);
                  local_78._0_4_ = SUB84(local_118.d.d,0);
                  local_78._4_4_ = (undefined4)((ulong)local_118.d.d >> 0x20);
                  puVar24 = (undefined8 *)CONCAT44(local_78._20_4_,local_78._16_4_);
                  local_78._8_4_ = SUB84(local_118.d.ptr,0);
                  local_78._12_4_ = (undefined4)((ulong)local_118.d.ptr >> 0x20);
                  local_78._16_4_ = (undefined4)local_118.d.size;
                  local_78._20_4_ = (undefined4)((ulong)local_118.d.size >> 0x20);
                  local_118.d.ptr = (char16_t *)pQVar5;
                  local_118.d.size = (qsizetype)puVar24;
                  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_118.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      local_118.d.d = (Data *)pQVar10;
                      QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                      pQVar10 = &(local_118.d.d)->super_QArrayData;
                    }
                  }
                  local_118.d.d = (Data *)pQVar10;
                  pcVar3 = local_118.d.ptr;
                  if ((undefined8 *)local_118.d.size == (undefined8 *)0x4) {
                    QVar89.m_data = local_118.d.ptr;
                    QVar89.m_size = 4;
                    QVar151.m_data = "disc";
                    QVar151.m_size = 4;
                    cVar11 = QtPrivate::equalStrings(QVar89,QVar151);
                    if (cVar11 == '\0') {
                      QVar91.m_data = pcVar3;
                      QVar91.m_size = 4;
                      QVar153.m_data = anon_var_dwarf_3a2fe6;
                      QVar153.m_size = 4;
                      cVar11 = QtPrivate::equalStrings(QVar91,QVar153);
                      if (cVar11 != '\0') {
                        this_02->listStyle = ListStyleUndefined;
                      }
                    }
                    else {
                      this_02->listStyle = ListDisc;
                    }
                  }
                  else if ((undefined1 *)local_118.d.size == &DAT_00000006) {
                    QVar88.m_data = local_118.d.ptr;
                    QVar88.m_size = 6;
                    QVar150.m_data = "square";
                    QVar150.m_size = 6;
                    cVar11 = QtPrivate::equalStrings(QVar88,QVar150);
                    if (cVar11 == '\0') {
                      QVar90.m_data = pcVar3;
                      QVar90.m_size = 6;
                      QVar152.m_data = "circle";
                      QVar152.m_size = 6;
                      cVar11 = QtPrivate::equalStrings(QVar90,QVar152);
                      if (cVar11 != '\0') {
                        this_02->listStyle = ListCircle;
                      }
                    }
                    else {
                      this_02->listStyle = ListSquare;
                    }
                  }
                }
              }
              goto switchD_00513631_caseD_4;
            }
            break;
          case Html_li:
            if (lVar18 == 5) {
              QVar43.m_data = pcVar3;
              QVar43.m_size = 5;
              QVar108.m_data = "class";
              QVar108.m_size = 5;
              cVar11 = QtPrivate::equalStrings(QVar43,QVar108);
              if (cVar11 != '\0') {
                if ((undefined8 *)local_118.d.size == (undefined8 *)0x7) {
                  QVar68.m_data = local_118.d.ptr;
                  QVar68.m_size = 7;
                  QVar130.m_data = "checked";
                  QVar130.m_size = 7;
                  cVar11 = QtPrivate::equalStrings(QVar68,QVar130);
                  if (cVar11 != '\0') {
                    iVar14 = 2;
                    goto LAB_00513bd1;
                  }
                }
                else if (((undefined8 *)local_118.d.size == (undefined8 *)0x9) &&
                        (QVar44.m_data = local_118.d.ptr, QVar44.m_size = 9,
                        QVar109.m_data = "unchecked", QVar109.m_size = 9,
                        cVar11 = QtPrivate::equalStrings(QVar44,QVar109), cVar11 != '\0')) {
                  iVar14 = 1;
LAB_00513bd1:
                  ::QVariant::QVariant((QVariant *)&local_78,iVar14);
                  QTextFormat::setProperty(&this_01->super_QTextFormat,0x10a0,(QVariant *)&local_78)
                  ;
                  ::QVariant::~QVariant((QVariant *)&local_78);
                }
              }
              goto switchD_00513631_caseD_5;
            }
            break;
          case Html_code:
          case Html_tt:
          case Html_kbd:
          case Html_samp:
          case Html_br:
          case Html_sub:
          case Html_sup:
            break;
          case Html_img:
            if (lVar18 != 6) {
              if (lVar18 == 5) {
                QVar55.m_data = pcVar3;
                QVar55.m_size = 5;
                QVar118.m_data = "width";
                QVar118.m_size = 5;
                cVar11 = QtPrivate::equalStrings(QVar55,QVar118);
                if (cVar11 == '\0') {
                  QVar63.m_data = pcVar3;
                  QVar63.m_size = 5;
                  QVar125.m_data = "title";
                  QVar125.m_size = 5;
                  cVar11 = QtPrivate::equalStrings(QVar63,QVar125);
                  if (cVar11 != '\0') {
                    QString::operator=(&this_02->text,(QString *)&local_118);
                  }
                }
                else {
                  this_02->imageWidth = -2.0;
                  local_78._0_4_ = local_78._0_4_ & 0xffffff00;
                  qVar27 = (qreal)QString::toDouble((bool *)&local_118);
                  if (local_78.data[0] == '\x01') {
                    this_02->imageWidth = qVar27;
                  }
                }
                goto switchD_00513631_caseD_5;
              }
              if (lVar18 != 3) break;
              QVar37.m_data = pcVar3;
              QVar37.m_size = 3;
              QVar104.m_data = "src";
              QVar104.m_size = 3;
              cVar11 = QtPrivate::equalStrings(QVar37,QVar104);
              if (cVar11 != '\0') goto LAB_00513415;
              QVar38.m_data = pcVar3;
              QVar38.m_size = 3;
              QVar105.m_data = "alt";
              QVar105.m_size = 3;
              cVar11 = QtPrivate::equalStrings(QVar38,QVar105);
              if (cVar11 != '\0') {
                QString::operator=(&this_02->imageAlt,(QString *)&local_118);
              }
              goto switchD_00513631_caseD_3;
            }
            QVar56.m_data = pcVar3;
            QVar56.m_size = 6;
            QVar119.m_data = "source";
            QVar119.m_size = 6;
            cVar11 = QtPrivate::equalStrings(QVar56,QVar119);
            if (cVar11 != '\0') {
LAB_00513415:
              QString::operator=(&this_02->imageName,(QString *)&local_118);
              break;
            }
            QVar64.m_data = pcVar3;
            QVar64.m_size = 6;
            QVar126.m_data = "height";
            QVar126.m_size = 6;
            cVar11 = QtPrivate::equalStrings(QVar64,QVar126);
            if (cVar11 == '\0') {
LAB_00514050:
              if (lVar18 != 2) {
                if (lVar18 == 3) goto switchD_00513631_caseD_3;
                if (lVar18 != 6) goto switchD_00513631_caseD_4;
                goto switchD_00513631_caseD_6;
              }
              goto switchD_00513631_caseD_2;
            }
            this_02->imageHeight = -2.0;
            local_78._0_4_ = local_78._0_4_ & 0xffffff00;
            qVar27 = (qreal)QString::toDouble((bool *)&local_118);
            if (local_78.data[0] == '\x01') {
              this_02->imageHeight = qVar27;
            }
            goto switchD_00513631_caseD_6;
          case Html_hr:
switchD_00512a36_caseD_1f:
            if (lVar18 == 5) goto switchD_00512c16_caseD_5;
            break;
          case Html_pre:
            if (lVar18 == 5) {
              QVar39.m_data = pcVar3;
              QVar39.m_size = 5;
              QVar106.m_data = "class";
              QVar106.m_size = 5;
              cVar11 = QtPrivate::equalStrings(QVar39,QVar106);
              if ((cVar11 != '\0') &&
                 (QVar40.m_data = (char *)0x9, QVar40.m_size = (qsizetype)&local_118,
                 cVar11 = QString::startsWith(QVar40,0x6af7a7), cVar11 != '\0')) {
                QString::mid((longlong)&local_b8,(longlong)&local_118);
                ::QVariant::QVariant((QVariant *)&local_78,(QString *)&local_b8);
                QTextFormat::setProperty(&this_01->super_QTextFormat,0x1090,(QVariant *)&local_78);
                ::QVariant::~QVariant((QVariant *)&local_78);
                if (local_b8.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
                  LOCK();
                  *(int *)local_b8.super_QStringTokenizerBaseBase =
                       *(int *)local_b8.super_QStringTokenizerBaseBase + -1;
                  UNLOCK();
                  if (*(int *)local_b8.super_QStringTokenizerBaseBase == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)local_b8.super_QStringTokenizerBaseBase,2,0x10);
                  }
                }
              }
              goto switchD_00513631_caseD_5;
            }
            break;
          default:
            if (QVar1 == Html_body) goto switchD_00512ae8_caseD_2e;
            if ((QVar1 == Html_a) && (lVar18 == 4)) {
              QVar31.m_data = pcVar3;
              QVar31.m_size = 4;
              QVar98.m_data = "href";
              QVar98.m_size = 4;
              cVar11 = QtPrivate::equalStrings(QVar31,QVar98);
              if (cVar11 != '\0') {
                ::QVariant::QVariant((QVariant *)&local_78,(QString *)&local_118);
                iVar14 = 0x2031;
                goto LAB_00512f4a;
              }
              QVar59.m_data = pcVar3;
              QVar59.m_size = 4;
              QVar122.m_data = "name";
              QVar122.m_size = 4;
              cVar11 = QtPrivate::equalStrings(QVar59,QVar122);
              qVar19 = local_118.d.size;
              pcVar9 = local_118.d.ptr;
              pDVar8 = local_118.d.d;
              if (cVar11 != '\0') {
                if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + 1;
                  UNLOCK();
                }
                local_78._0_4_ = 0xaaaaaaaa;
                local_78._4_4_ = 0xaaaaaaaa;
                local_b8.m_haystack.m_size =
                     QArrayData::allocate((QArrayData **)&local_78.shared,0x18,0x10,1,KeepSize);
                local_b8.super_QStringTokenizerBaseBase.m_cs = local_78._4_4_;
                local_b8.super_QStringTokenizerBaseBase.m_sb.
                super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                     (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
                     (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)local_78._0_4_;
                *(Data **)local_b8.m_haystack.m_size = pDVar8;
                *(char16_t **)(local_b8.m_haystack.m_size + 8) = pcVar9;
                *(qsizetype *)(local_b8.m_haystack.m_size + 0x10) = qVar19;
                if (&pDVar8->super_QArrayData == (QArrayData *)0x0) {
                  local_b8.m_haystack.m_data = (storage_type_conflict *)0x1;
                  ::QVariant::QVariant((QVariant *)&local_78,(QList_conflict *)&local_b8);
                  QTextFormat::setProperty(&this_00->super_QTextFormat,0x2032,(QVariant *)&local_78)
                  ;
                  ::QVariant::~QVariant((QVariant *)&local_78);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)&local_b8);
                }
                else {
                  LOCK();
                  (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                  local_b8.m_haystack.m_data = (storage_type_conflict *)0x1;
                  ::QVariant::QVariant((QVariant *)&local_78,(QList_conflict *)&local_b8);
                  QTextFormat::setProperty(&this_00->super_QTextFormat,0x2032,(QVariant *)&local_78)
                  ;
                  ::QVariant::~QVariant((QVariant *)&local_78);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)&local_b8);
                  LOCK();
                  (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                  }
                }
                goto LAB_00514050;
              }
              goto switchD_00513631_caseD_4;
            }
          }
          goto switchD_00512a36_caseD_19;
        }
        switch(QVar1) {
        case Html_table:
          switch(lVar18) {
          case 5:
switchD_00512c16_caseD_5:
            QVar30.m_data = pcVar3;
            QVar30.m_size = 5;
            QVar97.m_data = "width";
            QVar97.m_size = 5;
            cVar11 = QtPrivate::equalStrings(QVar30,QVar97);
            if (cVar11 != '\0') {
              setWidthAttribute(&this_02->width,&local_118);
            }
            goto switchD_00513631_caseD_5;
          case 6:
            QVar33.m_data = pcVar3;
            QVar33.m_size = 6;
            QVar100.m_data = "border";
            QVar100.m_size = 6;
            cVar11 = QtPrivate::equalStrings(QVar33,QVar100);
            if (((cVar11 == '\0') || (this_02->tableBorder != 0.0)) || (NAN(this_02->tableBorder)))
            {
              QVar65.m_data = pcVar3;
              QVar65.m_size = 6;
              QVar127.m_data = "height";
              QVar127.m_size = 6;
              cVar11 = QtPrivate::equalStrings(QVar65,QVar127);
              if (cVar11 != '\0') {
                setWidthAttribute(&this_02->height,&local_118);
              }
            }
            else {
              local_78._0_4_ = local_78._0_4_ & 0xffffff00;
              qVar27 = (qreal)QString::toDouble((bool *)&local_118);
              if (local_78.data[0] == '\x01') {
                this_02->tableBorder = qVar27;
              }
            }
            goto switchD_00513631_caseD_6;
          case 7:
switchD_00512c16_caseD_7:
            QVar45.m_data = pcVar3;
            QVar45.m_size = 7;
            QVar110.m_data = "bgcolor";
            QVar110.m_size = 7;
            cVar11 = QtPrivate::equalStrings(QVar45,QVar110);
            sVar23 = extraout_RDX;
            if (cVar11 != '\0') goto LAB_005130ad;
            break;
          default:
            goto switchD_00512a36_caseD_19;
          case 10:
switchD_00512c16_caseD_a:
            QVar34.m_data = pcVar3;
            QVar34.m_size = 10;
            QVar101.m_data = "background";
            QVar101.m_size = 10;
            cVar11 = QtPrivate::equalStrings(QVar34,QVar101);
            if (cVar11 != '\0') {
              QTextHtmlParserNode::applyBackgroundImage(this_02,&local_118,this->resourceProvider);
            }
            break;
          case 0xb:
            QVar60.m_data = pcVar3;
            QVar60.m_size = 0xb;
            QVar123.m_data = "bordercolor";
            QVar123.m_size = 0xb;
            cVar11 = QtPrivate::equalStrings(QVar60,QVar123);
            if (cVar11 == '\0') {
              QVar66.m_data = pcVar3;
              QVar66.m_size = 0xb;
              QVar128.m_data = "cellspacing";
              QVar128.m_size = 0xb;
              cVar11 = QtPrivate::equalStrings(QVar66,QVar128);
              if (cVar11 == '\0') {
                QVar77.m_data = pcVar3;
                QVar77.m_size = 0xb;
                QVar139.m_data = "cellpadding";
                QVar139.m_size = 0xb;
                cVar11 = QtPrivate::equalStrings(QVar77,QVar139);
                if (cVar11 != '\0') {
                  local_78._0_4_ = local_78._0_4_ & 0xffffff00;
                  qVar27 = (qreal)QString::toDouble((bool *)&local_118);
                  if (local_78.data[0] == '\x01') {
                    this_02->tableCellPadding = qVar27;
                  }
                }
              }
              else {
                local_78._0_4_ = local_78._0_4_ & 0xffffff00;
                qVar27 = (qreal)QString::toDouble((bool *)&local_118);
                if (local_78.data[0] == '\x01') {
                  this_02->tableCellSpacing = qVar27;
                }
              }
            }
            else {
              name_01.field_0.m_data = (void *)(local_118.d.size | 0x8000000000000000);
              name_01.m_size = extraout_RDX_02;
              QVar93 = QColor::fromString((QColor *)local_118.d.ptr,name_01);
              if (QVar93.cspec == Invalid) {
                local_78._0_4_ = 2;
                local_78._4_4_ = 0;
                local_78._8_4_ = 0;
                local_78._12_4_ = 0;
                local_78._16_4_ = 0;
                local_78._20_4_ = 0;
                pcStack_60 = "default";
                QString::toLatin1_helper((QString *)&local_b8);
                puVar24 = (undefined8 *)local_b8.m_haystack.m_size;
                if ((undefined8 *)local_b8.m_haystack.m_size == (undefined8 *)0x0) {
                  puVar24 = &QByteArray::_empty;
                }
                QMessageLogger::warning
                          ((char *)local_78.data,
                           "QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",puVar24);
                if (local_b8.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
                  LOCK();
                  *(int *)local_b8.super_QStringTokenizerBaseBase =
                       *(int *)local_b8.super_QStringTokenizerBaseBase + -1;
                  UNLOCK();
                  if (*(int *)local_b8.super_QStringTokenizerBaseBase == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)local_b8.super_QStringTokenizerBaseBase,1,0x10);
                  }
                }
              }
              color._8_8_ = QVar93._8_8_ & 0xffffffffffff | 0xaaaa000000000000;
              color._0_8_ = QVar93._0_8_;
              QBrush::operator=(&this_02->borderBrush,color);
            }
          }
          break;
        case Html_tr:
switchD_00512ae8_caseD_2e:
          if (lVar18 == 10) goto switchD_00512c16_caseD_a;
          if (lVar18 == 7) goto switchD_00512c16_caseD_7;
        default:
switchD_00512a36_caseD_19:
          switch(lVar18) {
          case 2:
switchD_00513631_caseD_2:
            QVar58.m_data = pcVar3;
            QVar58.m_size = 2;
            QVar121.m_data = "id";
            QVar121.m_size = 2;
            cVar11 = QtPrivate::equalStrings(QVar58,QVar121);
            if (cVar11 != '\0') {
              ::QVariant::QVariant((QVariant *)&local_78,true);
              QTextFormat::setProperty(&this_00->super_QTextFormat,0x2030,(QVariant *)&local_78);
              ::QVariant::~QVariant((QVariant *)&local_78);
              qVar19 = local_118.d.size;
              pcVar3 = local_118.d.ptr;
              pDVar8 = local_118.d.d;
              if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + 1;
                UNLOCK();
              }
              local_78._0_4_ = 0xaaaaaaaa;
              local_78._4_4_ = 0xaaaaaaaa;
              local_b8.m_haystack.m_size =
                   QArrayData::allocate((QArrayData **)&local_78.shared,0x18,0x10,1,KeepSize);
              local_b8.super_QStringTokenizerBaseBase.m_cs = local_78._4_4_;
              local_b8.super_QStringTokenizerBaseBase.m_sb.
              super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
              super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                   (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
                   (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)local_78._0_4_;
              *(Data **)local_b8.m_haystack.m_size = pDVar8;
              *(char16_t **)(local_b8.m_haystack.m_size + 8) = pcVar3;
              *(qsizetype *)(local_b8.m_haystack.m_size + 0x10) = qVar19;
              if (&pDVar8->super_QArrayData == (QArrayData *)0x0) {
                local_b8.m_haystack.m_data = (storage_type_conflict *)0x1;
                ::QVariant::QVariant((QVariant *)&local_78,(QList_conflict *)&local_b8);
                QTextFormat::setProperty(&this_00->super_QTextFormat,0x2032,(QVariant *)&local_78);
                ::QVariant::~QVariant((QVariant *)&local_78);
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)&local_b8);
              }
              else {
                LOCK();
                (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
                local_b8.m_haystack.m_data = (storage_type_conflict *)0x1;
                ::QVariant::QVariant((QVariant *)&local_78,(QList_conflict *)&local_b8);
                QTextFormat::setProperty(&this_00->super_QTextFormat,0x2032,(QVariant *)&local_78);
                ::QVariant::~QVariant((QVariant *)&local_78);
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)&local_b8);
                LOCK();
                (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                }
              }
            }
            break;
          case 3:
switchD_00513631_caseD_3:
            QVar81.m_data = pcVar3;
            QVar81.m_size = 3;
            QVar143.m_data = "dir";
            QVar143.m_size = 3;
            cVar11 = QtPrivate::equalStrings(QVar81,QVar143);
            if (cVar11 == '\0') break;
            QString::toLower_helper((QString *)local_78.data);
            pDVar8 = local_118.d.d;
            pQVar10 = (QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_);
            pQVar5 = (QColor *)CONCAT44(local_78._12_4_,local_78._8_4_);
            local_78._0_4_ = SUB84(local_118.d.d,0);
            local_78._4_4_ = (undefined4)((ulong)local_118.d.d >> 0x20);
            puVar24 = (undefined8 *)CONCAT44(local_78._20_4_,local_78._16_4_);
            local_78._8_4_ = SUB84(local_118.d.ptr,0);
            local_78._12_4_ = (undefined4)((ulong)local_118.d.ptr >> 0x20);
            local_78._16_4_ = (undefined4)local_118.d.size;
            local_78._20_4_ = (undefined4)((ulong)local_118.d.size >> 0x20);
            local_118.d.ptr = (char16_t *)pQVar5;
            local_118.d.size = (qsizetype)puVar24;
            if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                local_118.d.d = (Data *)pQVar10;
                QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                pQVar10 = &(local_118.d.d)->super_QArrayData;
              }
            }
            local_118.d.d = (Data *)pQVar10;
            pcVar3 = local_118.d.ptr;
            if ((undefined8 *)local_118.d.size != (undefined8 *)0x3) break;
            QVar82.m_data = local_118.d.ptr;
            QVar82.m_size = 3;
            QVar144.m_data = "ltr";
            QVar144.m_size = 3;
            cVar11 = QtPrivate::equalStrings(QVar82,QVar144);
            if (cVar11 == '\0') {
              QVar84.m_data = pcVar3;
              QVar84.m_size = 3;
              QVar146.m_data = "rtl";
              QVar146.m_size = 3;
              cVar11 = QtPrivate::equalStrings(QVar84,QVar146);
              if (cVar11 == '\0') break;
              iVar14 = 1;
            }
            else {
              iVar14 = 0;
            }
            ::QVariant::QVariant((QVariant *)&local_78,iVar14);
            iVar14 = 0x801;
            pQVar25 = &this_01->super_QTextFormat;
            goto LAB_005142e9;
          case 5:
switchD_00513631_caseD_5:
            QVar69.m_data = pcVar3;
            QVar69.m_size = 5;
            QVar131.m_data = "style";
            QVar131.m_size = 5;
            cVar11 = QtPrivate::equalStrings(QVar69,QVar131);
            if (cVar11 != '\0') {
              QTextHtmlParserNode::parseStyleAttribute(this_02,&local_118,this->resourceProvider);
              break;
            }
            QVar70.m_data = pcVar3;
            QVar70.m_size = 5;
            QVar132.m_data = "align";
            QVar132.m_size = 5;
            cVar11 = QtPrivate::equalStrings(QVar70,QVar132);
            if (cVar11 == '\0') {
              QVar72.m_data = pcVar3;
              QVar72.m_size = 5;
              QVar134.m_data = "title";
              QVar134.m_size = 5;
              cVar11 = QtPrivate::equalStrings(QVar72,QVar134);
              if (cVar11 != '\0') {
                ::QVariant::QVariant((QVariant *)&local_78,(QString *)&local_118);
                iVar14 = 0x2024;
                goto LAB_005142e9;
              }
              break;
            }
            QString::toLower_helper((QString *)local_78.data);
            pDVar8 = local_118.d.d;
            pQVar10 = (QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_);
            pQVar5 = (QColor *)CONCAT44(local_78._12_4_,local_78._8_4_);
            local_78._0_4_ = SUB84(local_118.d.d,0);
            local_78._4_4_ = (undefined4)((ulong)local_118.d.d >> 0x20);
            puVar24 = (undefined8 *)CONCAT44(local_78._20_4_,local_78._16_4_);
            local_78._8_4_ = SUB84(local_118.d.ptr,0);
            local_78._12_4_ = (undefined4)((ulong)local_118.d.ptr >> 0x20);
            local_78._16_4_ = (undefined4)local_118.d.size;
            local_78._20_4_ = (undefined4)((ulong)local_118.d.size >> 0x20);
            local_118.d.ptr = (char16_t *)pQVar5;
            local_118.d.size = (qsizetype)puVar24;
            if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                local_118.d.d = (Data *)pQVar10;
                QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                pQVar10 = &(local_118.d.d)->super_QArrayData;
              }
            }
            local_118.d.d = (Data *)pQVar10;
            switch(local_118.d.size) {
            case 4:
              QVar71.m_data = local_118.d.ptr;
              QVar71.m_size = 4;
              QVar133.m_data = "left";
              QVar133.m_size = 4;
              cVar11 = QtPrivate::equalStrings(QVar71,QVar133);
              if (cVar11 == '\0') break;
              iVar14 = 0x11;
LAB_00513e13:
              ::QVariant::QVariant((QVariant *)&local_78,iVar14);
              QTextFormat::setProperty(&this_01->super_QTextFormat,0x1010,(QVariant *)&local_78);
              ::QVariant::~QVariant((QVariant *)&local_78);
              bVar7 = true;
              goto LAB_00513e3d;
            case 5:
              QVar75.m_data = local_118.d.ptr;
              QVar75.m_size = 5;
              QVar137.m_data = "right";
              QVar137.m_size = 5;
              cVar11 = QtPrivate::equalStrings(QVar75,QVar137);
              if (cVar11 != '\0') {
                iVar14 = 0x12;
                goto LAB_00513e13;
              }
              break;
            case 6:
              QVar73.m_data = local_118.d.ptr;
              QVar73.m_size = 6;
              QVar135.m_data = "center";
              QVar135.m_size = 6;
              cVar11 = QtPrivate::equalStrings(QVar73,QVar135);
              if (cVar11 != '\0') {
                iVar14 = 4;
                goto LAB_00513e13;
              }
              break;
            case 7:
              QVar74.m_data = local_118.d.ptr;
              QVar74.m_size = 7;
              QVar136.m_data = "justify";
              QVar136.m_size = 7;
              cVar11 = QtPrivate::equalStrings(QVar74,QVar136);
              if (cVar11 != '\0') {
                iVar14 = 8;
                goto LAB_00513e13;
              }
            }
            bVar7 = false;
LAB_00513e3d:
            if (this_02->id == Html_img) {
              if (bVar7) {
                iVar14 = QTextFormat::intProperty(&this_01->super_QTextFormat,0x1010);
                if ((iVar14 + (uint)(iVar14 == 0) & 1) == 0) {
                  uVar15 = QTextFormat::intProperty(&this_01->super_QTextFormat,0x1010);
                  if ((uVar15 & 2) == 0) break;
                  uVar13 = (ushort)*(undefined4 *)&this_02->field_0x90 & 0xfffc | 2;
                }
                else {
                  uVar13 = ((ushort)*(undefined4 *)&this_02->field_0x90 & 0xfffc) + 1;
                }
                *(ushort *)&this_02->field_0x90 = uVar13;
              }
              else {
                if ((undefined8 *)local_118.d.size == (undefined8 *)0x3) goto LAB_00514126;
                if (((undefined1 *)local_118.d.size == &DAT_00000006) &&
                   (QVar76.m_data = local_118.d.ptr, QVar76.m_size = 6, QVar138.m_data = "middle",
                   QVar138.m_size = 6, cVar11 = QtPrivate::equalStrings(QVar76,QVar138),
                   cVar11 != '\0')) goto LAB_00514265;
              }
            }
            break;
          case 6:
switchD_00513631_caseD_6:
            QVar79.m_data = pcVar3;
            QVar79.m_size = 6;
            QVar141.m_data = "valign";
            QVar141.m_size = 6;
            cVar11 = QtPrivate::equalStrings(QVar79,QVar141);
            if (cVar11 == '\0') break;
            QString::toLower_helper((QString *)local_78.data);
            pDVar8 = local_118.d.d;
            pQVar10 = (QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_);
            pQVar5 = (QColor *)CONCAT44(local_78._12_4_,local_78._8_4_);
            local_78._0_4_ = SUB84(local_118.d.d,0);
            local_78._4_4_ = (undefined4)((ulong)local_118.d.d >> 0x20);
            puVar24 = (undefined8 *)CONCAT44(local_78._20_4_,local_78._16_4_);
            local_78._8_4_ = SUB84(local_118.d.ptr,0);
            local_78._12_4_ = (undefined4)((ulong)local_118.d.ptr >> 0x20);
            local_78._16_4_ = (undefined4)local_118.d.size;
            local_78._20_4_ = (undefined4)((ulong)local_118.d.size >> 0x20);
            local_118.d.ptr = (char16_t *)pQVar5;
            local_118.d.size = (qsizetype)puVar24;
            if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                local_118.d.d = (Data *)pQVar10;
                QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                pQVar10 = &(local_118.d.d)->super_QArrayData;
              }
            }
            local_118.d.d = (Data *)pQVar10;
            pcVar3 = local_118.d.ptr;
            if ((undefined1 *)local_118.d.size == &DAT_00000006) {
              QVar83.m_data = local_118.d.ptr;
              QVar83.m_size = 6;
              QVar145.m_data = "middle";
              QVar145.m_size = 6;
              cVar11 = QtPrivate::equalStrings(QVar83,QVar145);
              if (cVar11 == '\0') {
                QVar85.m_data = pcVar3;
                QVar85.m_size = 6;
                QVar147.m_data = "bottom";
                QVar147.m_size = 6;
                cVar11 = QtPrivate::equalStrings(QVar85,QVar147);
                if (cVar11 == '\0') break;
                iVar14 = 5;
              }
              else {
LAB_00514265:
                iVar14 = 3;
              }
            }
            else {
              if ((undefined8 *)local_118.d.size != (undefined8 *)0x3) break;
LAB_00514126:
              QVar80.m_data = local_118.d.ptr;
              QVar80.m_size = 3;
              QVar142.m_data = "top";
              QVar142.m_size = 3;
              cVar11 = QtPrivate::equalStrings(QVar80,QVar142);
              if (cVar11 == '\0') break;
              iVar14 = 4;
            }
            ::QVariant::QVariant((QVariant *)&local_78,iVar14);
            iVar14 = 0x2021;
LAB_005142e9:
            QTextFormat::setProperty(pQVar25,iVar14,(QVariant *)&local_78);
            ::QVariant::~QVariant((QVariant *)&local_78);
          }
          break;
        case Html_td:
        case Html_th:
          if (lVar18 == 10) goto switchD_00512c16_caseD_a;
          if (lVar18 != 7) goto switchD_00512a36_caseD_1f;
          QVar48.m_data = pcVar3;
          QVar48.m_size = 7;
          QVar112.m_data = "bgcolor";
          QVar112.m_size = 7;
          cVar11 = QtPrivate::equalStrings(QVar48,QVar112);
          sVar23 = extraout_RDX_00;
          if (cVar11 == '\0') {
            QVar53.m_data = pcVar3;
            QVar53.m_size = 7;
            QVar117.m_data = "rowspan";
            QVar117.m_size = 7;
            cVar11 = QtPrivate::equalStrings(QVar53,QVar117);
            if (cVar11 == '\0') {
              QVar61.m_data = pcVar3;
              QVar61.m_size = 7;
              QVar124.m_data = "colspan";
              QVar124.m_size = 7;
              cVar11 = QtPrivate::equalStrings(QVar61,QVar124);
              if (cVar11 != '\0') {
                local_78._0_4_ = local_78._0_4_ & 0xffffff00;
                QVar62.m_data = local_118.d.ptr;
                QVar62.m_size = local_118.d.size;
                uVar21 = QString::toIntegral_helper(QVar62,(bool *)local_78.data,10);
                if (((long)(int)uVar21 == uVar21) && ((local_78._0_4_ & 1) != 0)) {
                  uVar22 = 0x5000;
                  if (uVar21 < 0x5000) {
                    uVar22 = uVar21;
                  }
                  iVar14 = (int)uVar22;
                  if ((long)uVar21 < 2) {
                    iVar14 = 1;
                  }
                  this_02->tableCellColSpan = iVar14;
                }
              }
            }
            else {
              local_78._0_4_ = local_78._0_4_ & 0xffffff00;
              QVar54.m_data = local_118.d.ptr;
              QVar54.m_size = local_118.d.size;
              lVar18 = QString::toIntegral_helper(QVar54,(bool *)local_78.data,10);
              iVar14 = (int)lVar18;
              if ((iVar14 == lVar18) && ((local_78._0_4_ & 1) != 0)) {
                if (iVar14 < 2) {
                  iVar14 = 1;
                }
                this_02->tableCellRowSpan = iVar14;
              }
            }
            break;
          }
LAB_005130ad:
          local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
          name.field_0.m_data = (void *)(local_118.d.size | 0x8000000000000000);
          name.m_size = sVar23;
          QVar93 = QColor::fromString((QColor *)local_118.d.ptr,name);
          local_98.d = QVar93._0_8_;
          local_98.ptr._0_6_ = QVar93.ct._4_6_;
          if (QVar93.cspec == Invalid) {
            local_78._0_4_ = 2;
            local_78._4_4_ = 0;
            local_78._8_4_ = 0;
            local_78._12_4_ = 0;
            local_78._16_4_ = 0;
            local_78._20_4_ = 0;
            pcStack_60 = "default";
            QString::toLatin1_helper((QString *)&local_b8);
            puVar24 = (undefined8 *)local_b8.m_haystack.m_size;
            if ((undefined8 *)local_b8.m_haystack.m_size == (undefined8 *)0x0) {
              puVar24 = &QByteArray::_empty;
            }
            QMessageLogger::warning
                      ((char *)local_78.data,
                       "QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",puVar24);
            if (local_b8.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
              LOCK();
              *(int *)local_b8.super_QStringTokenizerBaseBase =
                   *(int *)local_b8.super_QStringTokenizerBaseBase + -1;
              UNLOCK();
              if (*(int *)local_b8.super_QStringTokenizerBaseBase == 0) {
                QArrayData::deallocate((QArrayData *)local_b8.super_QStringTokenizerBaseBase,1,0x10)
                ;
              }
            }
          }
          QBrush::QBrush((QBrush *)&local_b8,(QColor *)&local_98,SolidPattern);
          QBrush::operator_cast_to_QVariant((QVariant *)&local_78,(QBrush *)&local_b8);
          QTextFormat::setProperty(&this_00->super_QTextFormat,0x820,(QVariant *)&local_78);
          ::QVariant::~QVariant((QVariant *)&local_78);
          QBrush::~QBrush((QBrush *)&local_b8);
          break;
        case Html_meta:
          if (lVar18 == 7) {
            QVar49.m_data = pcVar3;
            QVar49.m_size = 7;
            QVar113.m_data = "content";
            QVar113.m_size = 7;
            cVar11 = QtPrivate::equalStrings(QVar49,QVar113);
            if (((cVar11 != '\0') && ((undefined8 *)local_118.d.size == (undefined8 *)0x1)) &&
               (QVar50.m_data = local_118.d.ptr, QVar50.m_size = 1, QVar114.m_data = "1",
               QVar114.m_size = 1, bVar12 = QtPrivate::equalStrings(QVar50,QVar114),
               (bVar12 & bVar20) == 1)) {
              this->textEditMode = true;
              bVar20 = 1;
            }
          }
          else {
            if (lVar18 != 4) goto switchD_00512a36_caseD_19;
            QVar35.m_data = pcVar3;
            QVar35.m_size = 4;
            QVar102.m_data = "name";
            QVar102.m_size = 4;
            cVar11 = QtPrivate::equalStrings(QVar35,QVar102);
            if ((cVar11 != '\0') && ((undefined8 *)local_118.d.size == (undefined8 *)0x9)) {
              QVar36.m_data = local_118.d.ptr;
              QVar36.m_size = 9;
              QVar103.m_data = "qrichtext";
              QVar103.m_size = 9;
              bVar12 = QtPrivate::equalStrings(QVar36,QVar103);
              bVar20 = bVar20 | bVar12;
            }
          }
          break;
        case Html_link:
          if (lVar18 != 4) goto switchD_00512a36_caseD_19;
          QVar32.m_data = pcVar3;
          QVar32.m_size = 4;
          QVar99.m_data = "href";
          QVar99.m_size = 4;
          cVar11 = QtPrivate::equalStrings(QVar32,QVar99);
          if (cVar11 == '\0') {
            QVar52.m_data = pcVar3;
            QVar52.m_size = 4;
            QVar116.m_data = "type";
            QVar116.m_size = 4;
            cVar11 = QtPrivate::equalStrings(QVar52,QVar116);
            if (cVar11 == '\0') break;
            pQVar17 = &local_f8;
          }
          else {
            pQVar17 = &local_d8;
          }
          QString::operator=(pQVar17,(QString *)&local_118);
        }
switchD_00513631_caseD_4:
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
        uVar26 = uVar26 + 2;
      } while (uVar26 < (ulong)(attributes->d).size);
    }
    if (((this->resourceProvider != (QTextDocument *)0x0) && (local_d8.d.size != 0)) &&
       ((local_f8.d.size == 8 &&
        (QVar92.m_data = local_f8.d.ptr, QVar92.m_size = 8, QVar154.m_data = "text/css",
        QVar154.m_size = 8, cVar11 = QtPrivate::equalStrings(QVar92,QVar154), cVar11 != '\0')))) {
      importStyleSheet(this,&local_d8);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlParser::applyAttributes(const QStringList &attributes)
{
    // local state variable for qt3 textedit mode
    bool seenQt3Richtext = false;
    QString linkHref;
    QString linkType;

    if (attributes.size() % 2 == 1)
        return;

    QTextHtmlParserNode *node = nodes.last();

    for (int i = 0; i < attributes.size(); i += 2) {
        QString key = attributes.at(i);
        QString value = attributes.at(i + 1);

        switch (node->id) {
            case Html_font:
                // the infamous font tag
                if (key == "size"_L1 && value.size()) {
                    int n = value.toInt();
                    if (value.at(0) != u'+' && value.at(0) != u'-')
                        n -= 3;
                    node->charFormat.setProperty(QTextFormat::FontSizeAdjustment, n);
                } else if (key == "face"_L1) {
                    if (value.contains(u',')) {
                        QStringList families;
                        for (auto family : value.tokenize(u','))
                            families << family.trimmed().toString();
                        node->charFormat.setFontFamilies(families);
                    } else {
                        node->charFormat.setFontFamilies(QStringList(value));
                    }
                } else if (key == "color"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setForeground(c);
                }
                break;
            case Html_ol:
            case Html_ul:
                if (key == "type"_L1) {
                    node->hasOwnListStyle = true;
                    if (value == "1"_L1) {
                        node->listStyle = QTextListFormat::ListDecimal;
                    } else if (value == "a"_L1) {
                        node->listStyle = QTextListFormat::ListLowerAlpha;
                    } else if (value == "A"_L1) {
                        node->listStyle = QTextListFormat::ListUpperAlpha;
                    } else if (value == "i"_L1) {
                        node->listStyle = QTextListFormat::ListLowerRoman;
                    } else if (value == "I"_L1) {
                        node->listStyle = QTextListFormat::ListUpperRoman;
                    } else {
                        value = std::move(value).toLower();
                        if (value == "square"_L1)
                            node->listStyle = QTextListFormat::ListSquare;
                        else if (value == "disc"_L1)
                            node->listStyle = QTextListFormat::ListDisc;
                        else if (value == "circle"_L1)
                            node->listStyle = QTextListFormat::ListCircle;
                        else if (value == "none"_L1)
                            node->listStyle = QTextListFormat::ListStyleUndefined;
                    }
                } else if (key == "start"_L1) {
                    setIntAttribute(&node->listStart, value);
                }
                break;
            case Html_li:
                if (key == "class"_L1) {
                    if (value == "unchecked"_L1)
                        node->blockFormat.setMarker(QTextBlockFormat::MarkerType::Unchecked);
                    else if (value == "checked"_L1)
                        node->blockFormat.setMarker(QTextBlockFormat::MarkerType::Checked);
                }
                break;
            case Html_a:
                if (key == "href"_L1)
                    node->charFormat.setAnchorHref(value);
                else if (key == "name"_L1)
                    node->charFormat.setAnchorNames({value});
                break;
            case Html_img:
                if (key == "src"_L1 || key == "source"_L1) {
                    node->imageName = value;
                } else if (key == "width"_L1) {
                    node->imageWidth = -2; // register that there is a value for it.
                    setFloatAttribute(&node->imageWidth, value);
                } else if (key == "height"_L1) {
                    node->imageHeight = -2; // register that there is a value for it.
                    setFloatAttribute(&node->imageHeight, value);
                } else if (key == "alt"_L1) {
                    node->imageAlt = value;
                } else if (key == "title"_L1) {
                    node->text = value;
                }
                break;
            case Html_tr:
            case Html_body:
                if (key == "bgcolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setBackground(c);
                } else if (key == "background"_L1) {
                    node->applyBackgroundImage(value, resourceProvider);
                }
                break;
            case Html_th:
            case Html_td:
                if (key == "width"_L1) {
                    setWidthAttribute(&node->width, value);
                } else if (key == "bgcolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setBackground(c);
                } else if (key == "background"_L1) {
                    node->applyBackgroundImage(value, resourceProvider);
                } else if (key == "rowspan"_L1) {
                    if (setIntAttribute(&node->tableCellRowSpan, value))
                        node->tableCellRowSpan = qMax(1, node->tableCellRowSpan);
                } else if (key == "colspan"_L1) {
                    if (setIntAttribute(&node->tableCellColSpan, value))
                        node->tableCellColSpan = qBound(1, node->tableCellColSpan, 20480);
                }
                break;
            case Html_table:
                // If table border already set through css style, prefer that one otherwise consider this value
                if (key == "border"_L1 && !node->tableBorder) {
                    setFloatAttribute(&node->tableBorder, value);
                } else if (key == "bgcolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setBackground(c);
                } else if (key == "bordercolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->borderBrush = c;
                } else if (key == "background"_L1) {
                    node->applyBackgroundImage(value, resourceProvider);
                } else if (key == "cellspacing"_L1) {
                    setFloatAttribute(&node->tableCellSpacing, value);
                } else if (key == "cellpadding"_L1) {
                    setFloatAttribute(&node->tableCellPadding, value);
                } else if (key == "width"_L1) {
                    setWidthAttribute(&node->width, value);
                } else if (key == "height"_L1) {
                    setWidthAttribute(&node->height, value);
                }
                break;
            case Html_meta:
                if (key == "name"_L1 && value == "qrichtext"_L1)
                    seenQt3Richtext = true;

                if (key == "content"_L1 && value == "1"_L1 && seenQt3Richtext)
                    textEditMode = true;
                break;
            case Html_hr:
                if (key == "width"_L1)
                    setWidthAttribute(&node->width, value);
                break;
            case Html_link:
                if (key == "href"_L1)
                    linkHref = value;
                else if (key == "type"_L1)
                    linkType = value;
                break;
            case Html_pre:
                if (key == "class"_L1 && value.startsWith("language-"_L1))
                    node->blockFormat.setProperty(QTextFormat::BlockCodeLanguage, value.mid(9));
                break;
            default:
                break;
        }

        if (key == "style"_L1) {
#ifndef QT_NO_CSSPARSER
            node->parseStyleAttribute(value, resourceProvider);
#endif
        } else if (key == "align"_L1) {
            value = std::move(value).toLower();
            bool alignmentSet = true;

            if (value == "left"_L1)
                node->blockFormat.setAlignment(Qt::AlignLeft|Qt::AlignAbsolute);
            else if (value == "right"_L1)
                node->blockFormat.setAlignment(Qt::AlignRight|Qt::AlignAbsolute);
            else if (value == "center"_L1)
                node->blockFormat.setAlignment(Qt::AlignHCenter);
            else if (value == "justify"_L1)
                node->blockFormat.setAlignment(Qt::AlignJustify);
            else
                alignmentSet = false;

            if (node->id == Html_img) {
                // HTML4 compat
                if (alignmentSet) {
                    if (node->blockFormat.alignment() & Qt::AlignLeft)
                        node->cssFloat = QTextFrameFormat::FloatLeft;
                    else if (node->blockFormat.alignment() & Qt::AlignRight)
                        node->cssFloat = QTextFrameFormat::FloatRight;
                } else if (value == "middle"_L1) {
                    node->charFormat.setVerticalAlignment(QTextCharFormat::AlignMiddle);
                } else if (value == "top"_L1) {
                    node->charFormat.setVerticalAlignment(QTextCharFormat::AlignTop);
                }
            }
        } else if (key == "valign"_L1) {
            value = std::move(value).toLower();
            if (value == "top"_L1)
                node->charFormat.setVerticalAlignment(QTextCharFormat::AlignTop);
            else if (value == "middle"_L1)
                node->charFormat.setVerticalAlignment(QTextCharFormat::AlignMiddle);
            else if (value == "bottom"_L1)
                node->charFormat.setVerticalAlignment(QTextCharFormat::AlignBottom);
        } else if (key == "dir"_L1) {
            value = std::move(value).toLower();
            if (value == "ltr"_L1)
                node->blockFormat.setLayoutDirection(Qt::LeftToRight);
            else if (value == "rtl"_L1)
                node->blockFormat.setLayoutDirection(Qt::RightToLeft);
        } else if (key == "title"_L1) {
            node->charFormat.setToolTip(value);
        } else if (key == "id"_L1) {
            node->charFormat.setAnchor(true);
            node->charFormat.setAnchorNames({value});
        }
    }

#ifndef QT_NO_CSSPARSER
    if (resourceProvider && !linkHref.isEmpty() && linkType == "text/css"_L1)
        importStyleSheet(linkHref);
#endif
}